

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgba64 * qt_fetch_linear_gradient_template<GradientBase64,QRgba64>
                    (QRgba64 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  long lVar1;
  Type fill;
  Type TVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int iVar3;
  QRgba64 *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  qreal y_1;
  qreal x_1;
  qreal rw;
  int inc_fixed;
  int t_fixed;
  QRgba64 *end;
  qreal ry;
  qreal rx;
  bool affine;
  qreal inc;
  qreal t;
  QRgba64 *b;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QGradientData *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  QRgba64 *pQVar5;
  Type *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  double local_a0;
  byte local_61;
  double local_60;
  QRgba64 *local_28;
  QRgba64 *pQVar4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_61 = 1;
  if ((*(double *)(in_RSI + 0x90) != 0.0) || (NAN(*(double *)(in_RSI + 0x90)))) {
    local_60 = *(double *)(in_RSI + 0x80) * *(double *)(in_RDX + 0x38) +
               *(double *)(in_RSI + 0x88) * *(double *)(in_RDX + 0x40);
    in_stack_ffffffffffffff4f = 0;
    if ((*(double *)(in_RDX + 0x48) == 0.0) && (!NAN(*(double *)(in_RDX + 0x48)))) {
      in_stack_ffffffffffffff4f = *(double *)(in_RDX + 0x60) != 0.0 ^ 0xff;
    }
    local_61 = in_stack_ffffffffffffff4f & 1;
    if (local_61 != 0) {
      local_60 = local_60 * 1023.0;
    }
  }
  else {
    local_60 = 0.0;
  }
  pQVar5 = in_RDI + in_R9D;
  local_28 = in_RDI;
  if (local_61 == 0) {
    local_a0 = *(double *)(in_RDX + 0x60) * ((double)in_ECX + 0.5) +
               *(double *)(in_RDX + 0x48) * ((double)in_R8D + 0.5) + *(double *)(in_RDX + 0x68);
    for (; local_28 < pQVar5; local_28 = local_28 + 1) {
      TVar2 = GradientBase64::fetchSingle
                        (in_stack_ffffffffffffff30,
                         (qreal)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_28->rgba = TVar2.rgba;
      local_a0 = *(double *)(in_RDX + 0x48) + local_a0;
      if ((local_a0 == 0.0) && (!NAN(local_a0))) {
        local_a0 = *(double *)(in_RDX + 0x48) + local_a0;
      }
    }
  }
  else if ((local_60 <= -1e-05) || (1e-05 <= local_60)) {
    pQVar4 = in_RDI;
    std::abs((int)in_RDI);
    iVar3 = (int)pQVar4;
    if ((4194303.0 <= extraout_XMM0_Qa_00) ||
       ((std::abs(iVar3), 4194303.0 <= extraout_XMM0_Qa_01 ||
        (std::abs(iVar3), 4194303.0 <= extraout_XMM0_Qa_02)))) {
      for (; local_28 < pQVar5; local_28 = local_28 + 1) {
        TVar2 = GradientBase64::fetchSingle
                          (in_stack_ffffffffffffff30,
                           (qreal)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        local_28->rgba = TVar2.rgba;
      }
    }
    else {
      for (; local_28 < pQVar5; local_28 = local_28 + 1) {
        TVar2 = GradientBase64::fetchSingle(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        local_28->rgba = TVar2.rgba;
      }
    }
  }
  else {
    std::abs((int)in_RDI);
    if (4194303.0 <= extraout_XMM0_Qa) {
      pQVar5 = in_RDI;
      GradientBase64::fetchSingle
                (in_stack_ffffffffffffff30,
                 (qreal)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      TVar2.rgba._7_1_ = in_stack_ffffffffffffff4f;
      TVar2.rgba._0_7_ = in_stack_ffffffffffffff48;
      GradientBase64::memfill(in_stack_ffffffffffffff40,TVar2,(int)((ulong)pQVar5 >> 0x20));
    }
    else {
      pQVar5 = in_RDI;
      GradientBase64::fetchSingle(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      fill.rgba._7_1_ = in_stack_ffffffffffffff4f;
      fill.rgba._0_7_ = in_stack_ffffffffffffff48;
      GradientBase64::memfill(pQVar5,fill,iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static inline const BlendType * QT_FASTCALL qt_fetch_linear_gradient_template(
        BlendType *buffer, const Operator *op, const QSpanData *data,
        int y, int x, int length)
{
    const BlendType *b = buffer;
    qreal t, inc;

    bool affine = true;
    qreal rx=0, ry=0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + qreal(0.5)) + data->m11 * (x + qreal(0.5)) + data->dx;
        ry = data->m22 * (y + qreal(0.5)) + data->m12 * (x + qreal(0.5)) + data->dy;
        t = op->linear.dx*rx + op->linear.dy*ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (GRADIENT_STOPTABLE_SIZE - 1);
            inc *= (GRADIENT_STOPTABLE_SIZE - 1);
        }
    }

    const BlendType *end = buffer + length;
    if (affine) {
        if (inc > qreal(-1e-5) && inc < qreal(1e-5)) {
            if (std::abs(t) < FIXPT_MAX)
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, int(t * FIXPT_SIZE)), length);
            else
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, t / GRADIENT_STOPTABLE_SIZE), length);
        } else {
            if (std::abs(t) < FIXPT_MAX && std::abs(inc) < FIXPT_MAX && std::abs(t + inc * length) < FIXPT_MAX) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t/GRADIENT_STOPTABLE_SIZE);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else { // fall back to float math here as well
        qreal rw = data->m23 * (y + qreal(0.5)) + data->m13 * (x + qreal(0.5)) + data->m33;
        while (buffer < end) {
            qreal x = rx/rw;
            qreal y = ry/rw;
            t = (op->linear.dx*x + op->linear.dy *y) + op->linear.off;

            *buffer = GradientBase::fetchSingle(data->gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }

    return b;
}